

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHash.h
# Opt level: O0

void __thiscall
HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void>::growTable
          (HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void> *this)

{
  HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void> *this_00;
  type puVar1;
  HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void> *in_RDI;
  u64 i;
  HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void> *in_stack_00000018;
  u64 oldCapactiy;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> oldMetadata;
  unique_ptr<HighsHashTableEntry<std::tuple<int,_int,_unsigned_int>,_void>,_HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void>::OpNewDeleter>
  oldEntries;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbf;
  HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void> *local_38;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *in_stack_ffffffffffffffd0;
  u64 in_stack_ffffffffffffffd8;
  
  std::
  unique_ptr<HighsHashTableEntry<std::tuple<int,_int,_unsigned_int>,_void>,_HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void>::OpNewDeleter>
  ::unique_ptr(&in_RDI->entries,
               (unique_ptr<HighsHashTableEntry<std::tuple<int,_int,_unsigned_int>,_void>,_HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void>::OpNewDeleter>
                *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
  std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::unique_ptr
            ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)in_RDI,
             (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
             CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
  this_00 = (HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void> *)(in_RDI->tableSizeMask + 1);
  makeEmptyTable(this_00,in_stack_ffffffffffffffd8);
  for (local_38 = (HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void> *)0x0;
      local_38 != this_00;
      local_38 = (HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void> *)
                 ((long)&(local_38->entries)._M_t.
                         super___uniq_ptr_impl<HighsHashTableEntry<std::tuple<int,_int,_unsigned_int>,_void>,_HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void>::OpNewDeleter>
                         ._M_t.
                         super__Tuple_impl<0UL,_HighsHashTableEntry<std::tuple<int,_int,_unsigned_int>,_void>_*,_HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void>::OpNewDeleter>
                         .
                         super__Head_base<0UL,_HighsHashTableEntry<std::tuple<int,_int,_unsigned_int>,_void>_*,_false>
                         ._M_head_impl + 1)) {
    puVar1 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator[]
                       ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)in_RDI
                        ,CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
    in_stack_ffffffffffffffbf = occupied(in_RDI,*puVar1);
    if ((bool)in_stack_ffffffffffffffbf) {
      std::
      unique_ptr<HighsHashTableEntry<std::tuple<int,_int,_unsigned_int>,_void>,_HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void>::OpNewDeleter>
      ::get(&in_RDI->entries);
      HighsHashTable<std::tuple<int,int,unsigned_int>,void>::
      insert<HighsHashTableEntry<std::tuple<int,int,unsigned_int>,void>>
                (in_stack_00000018,
                 (HighsHashTableEntry<std::tuple<int,_int,_unsigned_int>,_void> *)i);
    }
  }
  std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
            (in_stack_ffffffffffffffd0);
  std::
  unique_ptr<HighsHashTableEntry<std::tuple<int,_int,_unsigned_int>,_void>,_HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void>::OpNewDeleter>
  ::~unique_ptr(&in_RDI->entries);
  return;
}

Assistant:

void growTable() {
    decltype(entries) oldEntries = std::move(entries);
    decltype(metadata) oldMetadata = std::move(metadata);
    u64 oldCapactiy = tableSizeMask + 1;

    makeEmptyTable(2 * oldCapactiy);

    for (u64 i = 0; i != oldCapactiy; ++i)
      if (occupied(oldMetadata[i])) insert(std::move(oldEntries.get()[i]));
  }